

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O0

unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
duckdb::ParquetWriteInitializeGlobal
          (ClientContext *context,FunctionData *bind_data,string *file_path)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_RDX;
  FileSystem *unaff_RBX;
  ClientContext *in_RSI;
  unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_> in_RDI;
  ClientContext *unaff_R12;
  type *unaff_retaddr;
  ChildFieldIDs *in_stack_00000008;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  *in_stack_00000010;
  shared_ptr<duckdb::ParquetEncryptionConfig,_true> *in_stack_00000018;
  unsigned_long *in_stack_00000020;
  unsigned_long *in_stack_00000028;
  double *in_stack_00000030;
  long *in_stack_00000038;
  bool *in_stack_00000040;
  ParquetVersion *in_stack_00000048;
  FileSystem *fs;
  ParquetWriteBindData *parquet_bind;
  templated_unique_single_t global_state;
  type *ptVar1;
  FunctionData *in_stack_fffffffffffffec0;
  unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
  *this;
  unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
  local_88 [2];
  undefined8 local_78;
  ParquetWriteBindData *local_60;
  _Head_base<0UL,_duckdb::GlobalFunctionData_*,_false> args_2;
  
  args_2._M_head_impl =
       (GlobalFunctionData *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
       .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl;
  make_uniq<duckdb::ParquetWriteGlobalState>();
  local_60 = FunctionData::Cast<duckdb::ParquetWriteBindData>(in_stack_fffffffffffffec0);
  local_78 = duckdb::FileSystem::GetFileSystem(in_RSI);
  ptVar1 = &local_60->codec;
  ChildFieldIDs::Copy((ChildFieldIDs *)&local_60->column_names);
  this = local_88;
  make_uniq<duckdb::ParquetWriter,duckdb::ClientContext&,duckdb::FileSystem&,std::__cxx11::string_const&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<std::__cxx11::string,true>&,duckdb_parquet::CompressionCodec::type&,duckdb::ChildFieldIDs,duckdb::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,true>&,duckdb::shared_ptr<duckdb::ParquetEncryptionConfig,true>&,unsigned_long&,unsigned_long&,double&,long&,bool&,duckdb::ParquetVersion&>
            (unaff_R12,unaff_RBX,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             args_2._M_head_impl,(vector<duckdb::LogicalType,_true> *)in_RSI,in_RDX,unaff_retaddr,
             in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020,
             in_stack_00000028,in_stack_00000030,in_stack_00000038,in_stack_00000040,
             in_stack_00000048);
  unique_ptr<duckdb::ParquetWriteGlobalState,_std::default_delete<duckdb::ParquetWriteGlobalState>,_true>
  ::operator->((unique_ptr<duckdb::ParquetWriteGlobalState,_std::default_delete<duckdb::ParquetWriteGlobalState>,_true>
                *)this);
  unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>::operator=
            ((unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true> *)
             this,(unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>
                   *)ptVar1);
  unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ParquetWriter,_std::default_delete<duckdb::ParquetWriter>,_true> *)
             0x62dcef);
  ChildFieldIDs::~ChildFieldIDs((ChildFieldIDs *)0x62dcfc);
  unique_ptr<duckdb::GlobalFunctionData,std::default_delete<duckdb::GlobalFunctionData>,true>::
  unique_ptr<duckdb::ParquetWriteGlobalState,std::default_delete<std::unique_ptr<duckdb::GlobalFunctionData,std::default_delete<duckdb::GlobalFunctionData>>>,void>
            (this,(unique_ptr<duckdb::ParquetWriteGlobalState,_std::default_delete<duckdb::ParquetWriteGlobalState>_>
                   *)ptVar1);
  unique_ptr<duckdb::ParquetWriteGlobalState,_std::default_delete<duckdb::ParquetWriteGlobalState>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ParquetWriteGlobalState,_std::default_delete<duckdb::ParquetWriteGlobalState>,_true>
                 *)0x62dd1e);
  return (unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>)
         (__uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
          )in_RDI._M_t.
           super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
           .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalFunctionData> ParquetWriteInitializeGlobal(ClientContext &context, FunctionData &bind_data,
                                                            const string &file_path) {
	auto global_state = make_uniq<ParquetWriteGlobalState>();
	auto &parquet_bind = bind_data.Cast<ParquetWriteBindData>();

	auto &fs = FileSystem::GetFileSystem(context);
	global_state->writer = make_uniq<ParquetWriter>(
	    context, fs, file_path, parquet_bind.sql_types, parquet_bind.column_names, parquet_bind.codec,
	    parquet_bind.field_ids.Copy(), parquet_bind.kv_metadata, parquet_bind.encryption_config,
	    parquet_bind.dictionary_size_limit, parquet_bind.string_dictionary_page_size_limit,
	    parquet_bind.bloom_filter_false_positive_ratio, parquet_bind.compression_level, parquet_bind.debug_use_openssl,
	    parquet_bind.parquet_version);
	return std::move(global_state);
}